

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_collations.cpp
# Opt level: O2

void duckdb::PragmaCollateFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  _func_int **pp_Var1;
  GlobalTableFunctionState *pGVar2;
  reference pvVar3;
  _func_int **__n;
  _func_int **pp_Var4;
  string local_90;
  Value local_70;
  
  pGVar2 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  __n = pGVar2[4]._vptr_GlobalTableFunctionState;
  pp_Var4 = (_func_int **)
            ((long)pGVar2[2]._vptr_GlobalTableFunctionState -
             (long)pGVar2[1]._vptr_GlobalTableFunctionState >> 5);
  if (__n < pp_Var4) {
    if (__n + 0x100 < pp_Var4) {
      pp_Var4 = __n + 0x100;
    }
    output->count = (long)pp_Var4 - (long)__n;
    for (; __n < pp_Var4; __n = (_func_int **)((long)__n + 1)) {
      pp_Var1 = pGVar2[4]._vptr_GlobalTableFunctionState;
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            *)(pGVar2 + 1),(size_type)__n);
      ::std::__cxx11::string::string((string *)&local_90,(string *)pvVar3);
      Value::Value(&local_70,&local_90);
      DataChunk::SetValue(output,0,(long)__n - (long)pp_Var1,&local_70);
      Value::~Value(&local_70);
      ::std::__cxx11::string::~string((string *)&local_90);
    }
    pGVar2[4]._vptr_GlobalTableFunctionState = pp_Var4;
  }
  return;
}

Assistant:

static void PragmaCollateFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<PragmaCollateData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	idx_t next = MinValue<idx_t>(data.offset + STANDARD_VECTOR_SIZE, data.entries.size());
	output.SetCardinality(next - data.offset);
	for (idx_t i = data.offset; i < next; i++) {
		auto index = i - data.offset;
		output.SetValue(0, index, Value(data.entries[i]));
	}

	data.offset = next;
}